

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void when_button_cb(Fl_Light_Button *i,void *v)

{
  char cVar1;
  Fl_Type *pFVar2;
  bool bVar3;
  int iVar4;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar5;
  
  if ((char *)v == "LOAD") {
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar4 != 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    Fl_Button::value(&i->super_Fl_Button,current_widget->o->when_ & 2);
    return;
  }
  cVar1 = (i->super_Fl_Button).value_;
  bVar3 = false;
  ppFVar5 = &Fl_Type::first;
  while (pFVar2 = *ppFVar5, pFVar2 != (Fl_Type *)0x0) {
    if (pFVar2->selected != '\0') {
      iVar4 = (*pFVar2->_vptr_Fl_Type[0x17])(pFVar2);
      if (iVar4 != 0) {
        *(byte *)((long)&(pFVar2[1].prev)->header_position + 3) =
             *(byte *)((long)&(pFVar2[1].prev)->header_position + 3) & 0xfd |
             (cVar1 != '\0') * '\x02';
        bVar3 = true;
      }
    }
    ppFVar5 = &pFVar2->next;
  }
  if (bVar3) {
    set_modflag(1);
    return;
  }
  return;
}

Assistant:

void when_button_cb(Fl_Light_Button* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    i->value(current_widget->o->when()&FL_WHEN_NOT_CHANGED);
  } else {
    int mod = 0;
    int n = i->value() ? FL_WHEN_NOT_CHANGED : 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->when(n|(q->o->when()&~FL_WHEN_NOT_CHANGED));
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}